

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filemgr.cc
# Opt level: O0

fdb_status filemgr_does_file_exist(char *filename)

{
  filemgr_ops *pfVar1;
  char *in_RDI;
  int fd;
  filemgr_ops *ops;
  fdb_status local_4;
  
  pfVar1 = get_filemgr_ops();
  local_4 = (*pfVar1->open)(in_RDI,0,0x124);
  if (FDB_RESULT_INVALID_ARGS < local_4) {
    (*pfVar1->close)(local_4);
    local_4 = FDB_RESULT_SUCCESS;
  }
  return local_4;
}

Assistant:

fdb_status filemgr_does_file_exist(char *filename) {
    struct filemgr_ops *ops = get_filemgr_ops();
    int fd = ops->open(filename, O_RDONLY, 0444);
    if (fd < 0) {
        return (fdb_status) fd;
    }
    ops->close(fd);
    return FDB_RESULT_SUCCESS;
}